

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubDLevel::UpdateEdgeTags(ON_SubDLevel *this,bool bUnsetEdgeTagsOnly)

{
  double dVar1;
  double dVar2;
  ON_SubDEdgeTag OVar3;
  ON_SubDEdge *pOVar4;
  ON_SubDVertex *pOVar5;
  ON_SubDVertex *pOVar6;
  uint uVar7;
  uint uVar8;
  uint evi;
  long lVar9;
  ON_SubDEdge *pOVar10;
  bool bVar11;
  bool bVar12;
  
  if (this->m_edge[0] == (ON_SubDEdge *)0x0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    pOVar10 = this->m_edge[0];
    do {
      if ((pOVar10->m_face_count != 2) &&
         ((pOVar10->m_edge_tag == SmoothX || (pOVar10->m_edge_tag == Smooth)))) {
        pOVar10->m_edge_tag = Unset;
      }
      pOVar4 = pOVar10->m_next_edge;
      OVar3 = pOVar10->m_edge_tag;
      if ((!bUnsetEdgeTagsOnly) || (OVar3 == Unset)) {
        pOVar5 = pOVar10->m_vertex[0];
        if ((pOVar5 == (ON_SubDVertex *)0x0) ||
           (pOVar6 = pOVar10->m_vertex[1], pOVar6 == (ON_SubDVertex *)0x0)) {
          ON_SubDIncrementErrorCount();
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                     ,0x4cf9,"","nullptr edge->m_vertex[] values");
        }
        else {
          dVar1 = pOVar10->m_sector_coefficient[0];
          dVar2 = pOVar10->m_sector_coefficient[1];
          if (pOVar10->m_face_count == 2) {
            pOVar10->m_sector_coefficient[0] = -8883.0;
            pOVar10->m_sector_coefficient[1] = -8883.0;
            if (pOVar5->m_vertex_tag == Unset) {
              bVar11 = false;
            }
            else {
              bVar11 = pOVar6->m_vertex_tag != Unset;
            }
            uVar8 = 3;
            lVar9 = 0;
            do {
              if ((pOVar10->m_vertex[lVar9] != (ON_SubDVertex *)0x0) &&
                 ((byte)(pOVar10->m_vertex[lVar9]->m_vertex_tag - Crease) < 3)) {
                bVar12 = uVar8 == 3;
                uVar8 = 2;
                if (bVar12) {
                  uVar8 = (uint)lVar9;
                }
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 == 1);
            if (uVar8 < 2) {
              pOVar10->m_sector_coefficient[uVar8] = 0.0;
            }
            switch(OVar3) {
            case Unset:
              if (uVar8 == 2) {
LAB_005eeeee:
                pOVar10->m_edge_tag = SmoothX;
              }
              else if ((bVar11) && (pOVar10->m_edge_tag = Smooth, uVar8 == 3))
              goto switchD_005eeebf_caseD_2;
              break;
            case Smooth:
              if (uVar8 == 3) {
                if (bVar11) goto switchD_005eeebf_caseD_2;
              }
              else if (uVar8 == 2) goto LAB_005eeeee;
              break;
            case Crease:
              goto switchD_005eeebf_caseD_2;
            case SmoothX:
              if ((bool)(uVar8 != 2 & bVar11)) {
                pOVar10->m_edge_tag = Smooth;
              }
            }
          }
          else {
            pOVar10->m_edge_tag = Crease;
switchD_005eeebf_caseD_2:
            pOVar10->m_sector_coefficient[0] = 0.0;
            pOVar10->m_sector_coefficient[1] = 0.0;
          }
          if (OVar3 == pOVar10->m_edge_tag) {
            if ((dVar1 == pOVar10->m_sector_coefficient[0]) &&
               (!NAN(dVar1) && !NAN(pOVar10->m_sector_coefficient[0]))) {
              if ((dVar2 == pOVar10->m_sector_coefficient[1]) &&
                 (!NAN(dVar2) && !NAN(pOVar10->m_sector_coefficient[1]))) goto LAB_005eee43;
            }
          }
          uVar7 = uVar7 + 1;
        }
      }
LAB_005eee43:
      pOVar10 = pOVar4;
    } while (pOVar4 != (ON_SubDEdge *)0x0);
  }
  return uVar7;
}

Assistant:

unsigned int ON_SubDLevel::UpdateEdgeTags(
  bool bUnsetEdgeTagsOnly
  )
{
  // Update edge flags and sector coefficients.
  unsigned int edge_change_count = 0;
  ON_SubDEdge* next_edge = m_edge[0];
  for (ON_SubDEdge* edge = next_edge; nullptr != edge; edge = next_edge)
  {
    next_edge = const_cast<ON_SubDEdge*>(edge->m_next_edge);

    if (2 != edge->m_face_count && edge->IsSmooth())
    {
      // Dale Lear - Added April 5, 2021 - don't tolerate obvious errors / oversights.
      edge->m_edge_tag = ON_SubDEdgeTag::Unset;
    }

    const ON_SubDEdgeTag edge_tag0 = edge->m_edge_tag;
    if (bUnsetEdgeTagsOnly && ON_SubDEdgeTag::Unset != edge_tag0 )
    {
      continue;
    }

    if (nullptr == edge->m_vertex[0] || nullptr == edge->m_vertex[1])
    {
      ON_SUBD_ERROR("nullptr edge->m_vertex[] values");
      continue;
    }

    const double edge_sector_coefficient0[2] = { edge->m_sector_coefficient[0], edge->m_sector_coefficient[1] };

    if (2 != edge->m_face_count)
    {
      edge->m_edge_tag = ON_SubDEdgeTag::Crease;
      edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
    }
    else
    {
      edge->m_sector_coefficient[0] = ON_SubDSectorType::UnsetSectorCoefficient;
      edge->m_sector_coefficient[1] = ON_SubDSectorType::UnsetSectorCoefficient;
      const bool bBothVertexTagsAreSet
        =  ON_SubDVertexTag::Unset != edge->m_vertex[0]->m_vertex_tag
        && ON_SubDVertexTag::Unset != edge->m_vertex[1]->m_vertex_tag
        ;
      const unsigned int tagged_end_index = edge->TaggedEndIndex();
      if (0 == tagged_end_index || 1 == tagged_end_index)
        edge->m_sector_coefficient[tagged_end_index] = ON_SubDSectorType::IgnoredSectorCoefficient;

      switch (edge_tag0)
      {
      case ON_SubDEdgeTag::Unset:
        if (2 == tagged_end_index)
        {
          edge->m_edge_tag = ON_SubDEdgeTag::SmoothX;
        }
        else if ( bBothVertexTagsAreSet )
        {
          edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
          if (3 == tagged_end_index)
          {
            edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
            edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
          }
        }
        break;

      case ON_SubDEdgeTag::Smooth:
        if (2 == tagged_end_index)
        {
          edge->m_edge_tag = ON_SubDEdgeTag::SmoothX;
        }
        else if (3 == tagged_end_index && bBothVertexTagsAreSet)
        {
          edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
          edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
        }
        break;

      case ON_SubDEdgeTag::Crease:
        edge->m_sector_coefficient[0] = ON_SubDSectorType::IgnoredSectorCoefficient;
        edge->m_sector_coefficient[1] = ON_SubDSectorType::IgnoredSectorCoefficient;
        break;

      case ON_SubDEdgeTag::SmoothX:
        if ( 2 != tagged_end_index && bBothVertexTagsAreSet)
          edge->m_edge_tag = ON_SubDEdgeTag::Smooth;
        break;

      default:
        break;
      }
    }

    if (!(edge_tag0 == edge->m_edge_tag
      && edge_sector_coefficient0[0] == edge->m_sector_coefficient[0]
      && edge_sector_coefficient0[1] == edge->m_sector_coefficient[1]))
      edge_change_count++;
  }

  return edge_change_count;
}